

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# main.c
# Opt level: O3

wchar_t canLzma(void)

{
  wchar_t wVar1;
  
  if (canLzma_tested == '\0') {
    canLzma_tested = '\x01';
    wVar1 = systemf("lzma -V %s",">/dev/null 2>/dev/null");
    if (wVar1 == L'\0') {
      canLzma_value = 1;
    }
  }
  return (uint)canLzma_value;
}

Assistant:

int
canLzma(void)
{
	static int tested = 0, value = 0;
	if (!tested) {
		tested = 1;
		if (systemf("lzma -V %s", redirectArgs) == 0)
			value = 1;
	}
	return (value);
}